

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O0

void mpz_mul_2exp(__mpz_struct *r,__mpz_struct *u,mp_bitcnt_t bits)

{
  long n;
  ulong n_00;
  mp_ptr rp_00;
  mp_limb_t mVar1;
  ulong in_RDX;
  long in_RSI;
  int *in_RDI;
  mp_limb_t cy;
  mp_ptr rp;
  uint shift;
  mp_size_t limbs;
  mp_size_t rn;
  mp_size_t un;
  int local_60;
  mp_size_t in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar2;
  long local_28;
  
  if (*(int *)(in_RSI + 4) < 0) {
    iVar2 = -*(int *)(in_RSI + 4);
  }
  else {
    iVar2 = *(int *)(in_RSI + 4);
  }
  n = (long)iVar2;
  if (n == 0) {
    in_RDI[1] = 0;
  }
  else {
    n_00 = in_RDX >> 6;
    local_28 = n + n_00 + (ulong)((in_RDX & 0x3f) != 0);
    if (*in_RDI < local_28) {
      rp_00 = mpz_realloc((__mpz_struct *)CONCAT44(iVar2,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffa8);
    }
    else {
      rp_00 = *(mp_ptr *)(in_RDI + 2);
    }
    if ((in_RDX & 0x3f) == 0) {
      mpn_copyd(rp_00 + n_00,*(mp_srcptr *)(in_RSI + 8),n);
    }
    else {
      mVar1 = mpn_lshift(rp_00 + n_00,*(mp_srcptr *)(in_RSI + 8),n,(uint)in_RDX & 0x3f);
      rp_00[local_28 + -1] = mVar1;
      local_28 = local_28 - (ulong)(mVar1 == 0);
    }
    mpn_zero(rp_00,n_00);
    local_60 = (int)local_28;
    if (*(int *)(in_RSI + 4) < 0) {
      local_60 = -local_60;
    }
    in_RDI[1] = local_60;
  }
  return;
}

Assistant:

void
mpz_mul_2exp (mpz_t r, const mpz_t u, mp_bitcnt_t bits)
{
  mp_size_t un, rn;
  mp_size_t limbs;
  unsigned shift;
  mp_ptr rp;

  un = GMP_ABS (u->_mp_size);
  if (un == 0)
    {
      r->_mp_size = 0;
      return;
    }

  limbs = bits / GMP_LIMB_BITS;
  shift = bits % GMP_LIMB_BITS;

  rn = un + limbs + (shift > 0);
  rp = MPZ_REALLOC (r, rn);
  if (shift > 0)
    {
      mp_limb_t cy = mpn_lshift (rp + limbs, u->_mp_d, un, shift);
      rp[rn-1] = cy;
      rn -= (cy == 0);
    }
  else
    mpn_copyd (rp + limbs, u->_mp_d, un);

  mpn_zero (rp, limbs);

  r->_mp_size = (u->_mp_size < 0) ? - rn : rn;
}